

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O0

void externalSubsetDebug(void *ctx,xmlChar *name,xmlChar *ExternalID,xmlChar *SystemID)

{
  xmllintState *lint;
  xmlChar *SystemID_local;
  xmlChar *ExternalID_local;
  xmlChar *name_local;
  void *ctx_local;
  
  *(int *)((long)ctx + 0x24) = *(int *)((long)ctx + 0x24) + 1;
  if (*(int *)((long)ctx + 0x34) == 0) {
    fprintf(_stdout,"SAX.externalSubset(%s,",name);
    if (ExternalID == (xmlChar *)0x0) {
      fprintf(_stdout," ,");
    }
    else {
      fprintf(_stdout," %s,",ExternalID);
    }
    if (SystemID == (xmlChar *)0x0) {
      fprintf(_stdout," )\n");
    }
    else {
      fprintf(_stdout," %s)\n",SystemID);
    }
  }
  return;
}

Assistant:

static void
externalSubsetDebug(void *ctx, const xmlChar *name,
	       const xmlChar *ExternalID, const xmlChar *SystemID)
{
    xmllintState *lint = ctx;

    lint->callbacks++;
    if (lint->noout)
	return;
    fprintf(stdout, "SAX.externalSubset(%s,", name);
    if (ExternalID == NULL)
	fprintf(stdout, " ,");
    else
	fprintf(stdout, " %s,", ExternalID);
    if (SystemID == NULL)
	fprintf(stdout, " )\n");
    else
	fprintf(stdout, " %s)\n", SystemID);
}